

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.h
# Opt level: O1

int8_t mpack_node_exttype(mpack_node_t node)

{
  mpack_tree_t *pmVar1;
  
  pmVar1 = node.tree;
  if (pmVar1->error == mpack_ok) {
    if ((node.data)->type == mpack_type_ext) {
      return (pmVar1->data + -1)[(long)((node.data)->value).children];
    }
    pmVar1->error = mpack_error_type;
    if (pmVar1->error_fn != (mpack_tree_error_t)0x0) {
      (*pmVar1->error_fn)(pmVar1,mpack_error_type);
      return '\0';
    }
  }
  return '\0';
}

Assistant:

MPACK_INLINE int8_t mpack_node_exttype(mpack_node_t node) {
    if (mpack_node_error(node) != mpack_ok)
        return 0;

    if (node.data->type == mpack_type_ext)
        return mpack_node_exttype_unchecked(node);

    mpack_node_flag_error(node, mpack_error_type);
    return 0;
}